

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_common.h
# Opt level: O3

bool date::
     read<std::istreambuf_iterator<char,std::char_traits<char>>,date::optional_t<date::aliases_t<char,4ul,unsigned_char,7ul>,date::characters_t<char,3ul>>,date::unsigned_integer_t<unsigned_char,1u,2u>,date::character_t<char>,date::aliases_t<char,4ul,unsigned_char,12ul>,date::character_t<char>,date::unsigned_integer_t<unsigned_short,2u,4u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::optional_t<date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>>,date::character_t<char>,date::cases_t<date::branch_t<date::aliases_t<char,4ul,short,11ul>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>>>
               (istreambuf_iterator<char,_std::char_traits<char>_> *pos,
               istreambuf_iterator<char,_std::char_traits<char>_> *end,
               tuple<date::optional_t<date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
               *format)

{
  bool bVar1;
  input_wrapper_t<std::istreambuf_iterator<char,_std::char_traits<char>_>,_34UL,_true> wrapper;
  
  wrapper.m_cache[0x18] = '\0';
  wrapper.m_cache[0x19] = '\0';
  wrapper.m_cache[0x1a] = '\0';
  wrapper.m_cache[0x1b] = '\0';
  wrapper.m_cache[0x1c] = '\0';
  wrapper.m_cache[0x1d] = '\0';
  wrapper.m_cache[0x1e] = '\0';
  wrapper.m_cache[0x1f] = '\0';
  wrapper.m_cache[0x20] = '\0';
  wrapper.m_cache[0x21] = '\0';
  wrapper.m_cache[8] = '\0';
  wrapper.m_cache[9] = '\0';
  wrapper.m_cache[10] = '\0';
  wrapper.m_cache[0xb] = '\0';
  wrapper.m_cache[0xc] = '\0';
  wrapper.m_cache[0xd] = '\0';
  wrapper.m_cache[0xe] = '\0';
  wrapper.m_cache[0xf] = '\0';
  wrapper.m_cache[0x10] = '\0';
  wrapper.m_cache[0x11] = '\0';
  wrapper.m_cache[0x12] = '\0';
  wrapper.m_cache[0x13] = '\0';
  wrapper.m_cache[0x14] = '\0';
  wrapper.m_cache[0x15] = '\0';
  wrapper.m_cache[0x16] = '\0';
  wrapper.m_cache[0x17] = '\0';
  wrapper.m_cacheSize = 0;
  wrapper.m_cache[0] = '\0';
  wrapper.m_cache[1] = '\0';
  wrapper.m_cache[2] = '\0';
  wrapper.m_cache[3] = '\0';
  wrapper.m_cache[4] = '\0';
  wrapper.m_cache[5] = '\0';
  wrapper.m_cache[6] = '\0';
  wrapper.m_cache[7] = '\0';
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::iterator_proxy
            (&wrapper.m_proxyIt,pos,end,wrapper.m_cache,&wrapper.m_cacheSize);
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::iterator_proxy
            (&wrapper.m_proxyEnd,end,end,wrapper.m_cache,&wrapper.m_cacheSize);
  bVar1 = read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,date::aliases_t<char,4ul,unsigned_char,7ul>,date::characters_t<char,3ul>,date::unsigned_integer_t<unsigned_char,1u,2u>&,date::character_t<char>&,date::aliases_t<char,4ul,unsigned_char,12ul>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_short,2u,4u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::character_t<char>&,date::unsigned_integer_t<unsigned_char,2u,2u>&,date::optional_t<date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>>&,date::character_t<char>&,date::cases_t<date::branch_t<date::aliases_t<char,4ul,short,11ul>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>>&>
                    (&wrapper.m_proxyIt,&wrapper.m_proxyEnd,
                     &(format->
                      super__Tuple_impl<0UL,_date::optional_t<date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                      ).
                      super__Head_base<0UL,_date::optional_t<date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>,_false>
                      ._M_head_impl,
                     &(format->
                      super__Tuple_impl<0UL,_date::optional_t<date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                      ).
                      super__Tuple_impl<1UL,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                      .super__Head_base<1UL,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_false>
                      ._M_head_impl,
                     &(format->
                      super__Tuple_impl<0UL,_date::optional_t<date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                      ).
                      super__Tuple_impl<1UL,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                      .
                      super__Tuple_impl<2UL,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                      .super__Head_base<2UL,_date::character_t<char>,_false>._M_head_impl,
                     &(format->
                      super__Tuple_impl<0UL,_date::optional_t<date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                      ).
                      super__Tuple_impl<1UL,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                      .
                      super__Tuple_impl<2UL,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                      .
                      super__Tuple_impl<3UL,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                      .super__Head_base<3UL,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_false>
                      ._M_head_impl,
                     &(format->
                      super__Tuple_impl<0UL,_date::optional_t<date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                      ).
                      super__Tuple_impl<1UL,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                      .
                      super__Tuple_impl<2UL,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                      .
                      super__Tuple_impl<3UL,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                      .
                      super__Tuple_impl<4UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                      .super__Head_base<4UL,_date::character_t<char>,_false>._M_head_impl,
                     &(format->
                      super__Tuple_impl<0UL,_date::optional_t<date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                      ).
                      super__Tuple_impl<1UL,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                      .
                      super__Tuple_impl<2UL,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                      .
                      super__Tuple_impl<3UL,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                      .
                      super__Tuple_impl<4UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                      .
                      super__Tuple_impl<5UL,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                      .
                      super__Head_base<5UL,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_false>
                      ._M_head_impl,
                     (character_t<char> *)
                     ((long)&(format->
                             super__Tuple_impl<0UL,_date::optional_t<date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                             ).
                             super__Tuple_impl<1UL,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                             .
                             super__Tuple_impl<2UL,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                             .
                             super__Tuple_impl<3UL,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                             .
                             super__Tuple_impl<4UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                             .
                             super__Tuple_impl<5UL,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                             .
                             super__Tuple_impl<6UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                     + 0x50),(unsigned_integer_t<unsigned_char,_2U,_2U> *)
                             ((long)&(format->
                                     super__Tuple_impl<0UL,_date::optional_t<date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                                     ).
                                     super__Tuple_impl<1UL,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                                     .
                                     super__Tuple_impl<2UL,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                                     .
                                     super__Tuple_impl<3UL,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                                     .
                                     super__Tuple_impl<4UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                                     .
                                     super__Tuple_impl<5UL,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                                     .
                                     super__Tuple_impl<6UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                             + 0x48),
                     (character_t<char> *)
                     ((long)&(format->
                             super__Tuple_impl<0UL,_date::optional_t<date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                             ).
                             super__Tuple_impl<1UL,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                             .
                             super__Tuple_impl<2UL,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                             .
                             super__Tuple_impl<3UL,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                             .
                             super__Tuple_impl<4UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                             .
                             super__Tuple_impl<5UL,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                             .
                             super__Tuple_impl<6UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                     + 0x40),(unsigned_integer_t<unsigned_char,_2U,_2U> *)
                             ((long)&(format->
                                     super__Tuple_impl<0UL,_date::optional_t<date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                                     ).
                                     super__Tuple_impl<1UL,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                                     .
                                     super__Tuple_impl<2UL,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                                     .
                                     super__Tuple_impl<3UL,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                                     .
                                     super__Tuple_impl<4UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                                     .
                                     super__Tuple_impl<5UL,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                                     .
                                     super__Tuple_impl<6UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                             + 0x38),
                     (optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>
                      *)((long)&(format->
                                super__Tuple_impl<0UL,_date::optional_t<date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                                ).
                                super__Tuple_impl<1UL,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                                .
                                super__Tuple_impl<2UL,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                                .
                                super__Tuple_impl<3UL,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                                .
                                super__Tuple_impl<4UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                                .
                                super__Tuple_impl<5UL,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                                .
                                super__Tuple_impl<6UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                        + 0x28),
                     (character_t<char> *)
                     ((long)&(format->
                             super__Tuple_impl<0UL,_date::optional_t<date::aliases_t<char,_4UL,_unsigned_char,_7UL>,_date::characters_t<char,_3UL>_>,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                             ).
                             super__Tuple_impl<1UL,_date::unsigned_integer_t<unsigned_char,_1U,_2U>,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                             .
                             super__Tuple_impl<2UL,_date::character_t<char>,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                             .
                             super__Tuple_impl<3UL,_date::aliases_t<char,_4UL,_unsigned_char,_12UL>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                             .
                             super__Tuple_impl<4UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                             .
                             super__Tuple_impl<5UL,_date::unsigned_integer_t<unsigned_short,_2U,_4U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                             .
                             super__Tuple_impl<6UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>,_date::optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>,_date::character_t<char>,_date::cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>_>
                     + 0x20),(cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
                              *)format);
  return bVar1;
}

Assistant:

bool read(Iterator& pos, const Iterator& end, std::tuple<Formatters...>& format)
{
    enum : unsigned { max_length = args_traits<Formatters...>::max_length };
    enum : bool { need_cache = args_traits<Formatters...>::need_cache && input_traits<Iterator>::need_cache };
    
    input_wrapper_t<Iterator, max_length, need_cache> wrapper(pos, end);
    return read_impl(wrapper.begin(), wrapper.end(), format, std_impl::make_index_sequence<sizeof...(Formatters)>{});
}